

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::bldFineLevels(Amr *this,Real strt_time)

{
  undefined8 *puVar1;
  int iVar2;
  pointer puVar3;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  pointer pBVar8;
  bool bVar9;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  long lVar15;
  byte bVar16;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grids;
  DistributionMapping new_dm;
  int local_6c;
  Real local_68;
  ulong local_60;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_58;
  allocator_type local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar16 = 0;
  *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = 0;
  local_68 = strt_time;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_58,(long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
             local_40);
  while( true ) {
    grid_places(this,*(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,local_68,
                &local_6c,(Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_58);
    iVar7 = local_6c;
    iVar2 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (local_6c <= iVar2) break;
    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = local_6c;
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)local_40,
               local_58.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
               _M_impl.super__Vector_impl_data._M_start + local_6c,
               *(int *)(ParallelContext::frames + 0x10));
    lVar12 = (long)local_6c;
    _Var10.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
         (**(code **)(*(long *)this->levelbld + 0x30))
                   (local_68,this->levelbld,this,lVar12,
                    (this->super_AmrCore).super_AmrMesh.geom.
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar12,
                    local_58.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar12,local_40);
    puVar3 = (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar4.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
          &puVar3[local_6c]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    puVar3[local_6c]._M_t.
    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> =
         _Var10.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
         super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
    if (tVar4.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
      (**(code **)(*(long *)tVar4.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
    }
    AmrMesh::SetBoxArray
              ((AmrMesh *)this,local_6c,
               local_58.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
               _M_impl.super__Vector_impl_data._M_start + local_6c);
    AmrMesh::SetDistributionMap((AmrMesh *)this,local_6c,(DistributionMapping *)local_40);
    (**(code **)(*(long *)(this->amr_level).
                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_6c]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                + 0xb8))();
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((iVar7 <= iVar2) ||
       ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level <=
        *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c)) break;
  }
  if (((this->regrid_grids_file)._M_string_length == 0) ||
     (((local_68 == 0.0 && (!NAN(local_68))) && ((this->initial_grids_file)._M_string_length != 0)))
     ) {
    local_60 = 0;
    do {
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar12 = -1;
        lVar15 = 0x50;
        do {
          pBVar8 = local_58.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          _Var10.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12 + 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          puVar1 = (undefined8 *)
                   ((long)local_58.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar15 + -0x50);
          puVar13 = (undefined8 *)
                    ((long)_Var10.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8);
          puVar14 = puVar1;
          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar14 = *puVar13;
            puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
            puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
          }
          puVar1[9] = *(undefined8 *)
                       ((long)_Var10.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x120)
          ;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((local_58.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                     lVar15),(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             ((long)_Var10.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                             0x128));
          puVar1[0xb] = *(undefined8 *)
                         ((long)_Var10.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x130);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(pBVar8->m_bat).m_op + lVar15 + 0xc),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)_Var10.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x138));
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + 0x68;
        } while (lVar12 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(local_68,this,0,1);
      bVar6 = true;
      if (-1 < *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
        lVar15 = 0;
        lVar12 = 0;
        bVar6 = true;
        do {
          bVar9 = BoxArray::operator==
                            ((BoxArray *)
                             ((long)&((local_58.
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                             + lVar15),
                             (BoxArray *)
                             ((long)(this->amr_level).
                                    super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                    .
                                    super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                             + 0xd8));
          if (!bVar9) {
            bVar6 = false;
          }
          if (*(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c <= lVar12)
          break;
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + 0x68;
        } while (bVar6);
      }
    } while ((!bVar6) && (uVar5 = (uint)local_60, local_60 = (ulong)(uVar5 + 1), uVar5 < 3));
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_58);
  return;
}

Assistant:

void
Amr::bldFineLevels (Real strt_time)
{
    BL_PROFILE("Amr::bldFineLevels()");
    finest_level = 0;

    Vector<BoxArray> new_grids(max_level+1);
    //
    // Get initial grid placement.
    //
    do
    {
        int new_finest;

        grid_places(finest_level,strt_time,new_finest,new_grids);

        if (new_finest <= finest_level) break;
        //
        // Create a new level and link with others.
        //
        finest_level = new_finest;

        DistributionMapping new_dm {new_grids[new_finest]};

        AmrLevel* level = (*levelbld)(*this,
                                      new_finest,
                                      Geom(new_finest),
                                      new_grids[new_finest],
                                      new_dm,
                                      strt_time);

        amr_level[new_finest].reset(level);
        this->SetBoxArray(new_finest, new_grids[new_finest]);
        this->SetDistributionMap(new_finest, new_dm);

        amr_level[new_finest]->initData();
    }
    while (finest_level < max_level);
    //
    // Iterate grids to ensure fine grids encompass all interesting gunk.
    //     but only iterate if we did not provide a grids file.
    //
    if ( regrid_grids_file.empty() || (strt_time == 0.0 && !initial_grids_file.empty()) )
    {
        bool grids_the_same;

        const int MaxCnt = 4;

        int count = 0;

        do
        {
            for (int i = 0; i <= finest_level; i++) {
                new_grids[i] = amr_level[i]->boxArray();
            }

            regrid(0,strt_time,true);

            grids_the_same = true;

            for (int i = 0; i <= finest_level && grids_the_same; i++) {
                if (!(new_grids[i] == amr_level[i]->boxArray())) {
                    grids_the_same = false;
                }
            }

            count++;
        }
        while (!grids_the_same && count < MaxCnt);
    }
}